

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_ray_tracing_reorder.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::val::RayReorderNVPass(val *this,ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  spv_result_t sVar5;
  uint32_t uVar6;
  uint uVar7;
  StorageClass SVar8;
  Instruction *pIVar9;
  Function *pFVar10;
  ulong uVar11;
  char *pcVar12;
  uint32_t instance_id_index;
  uint32_t primtive_id_index;
  uint32_t geometry_index;
  Op opcode;
  uint32_t ray_flags_index;
  uint32_t cull_mask_index;
  uint32_t hit_kind_index;
  uint32_t sbt_offset_index;
  uint32_t sbt_stride_index;
  uint32_t sbt_record_stride_index;
  uint32_t miss_index;
  uint32_t ray_origin_index;
  uint32_t ray_tmin_index;
  uint32_t ray_direction_index;
  uint32_t ray_tmax_index;
  uint32_t payload_index;
  uint32_t hit_object_attr_index;
  uint32_t component_type;
  uint32_t num_cols;
  uint32_t col_type;
  uint32_t num_rows;
  DiagnosticStream local_248;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  uVar1 = *(ushort *)((long)&(_->unresolved_forward_ids_)._M_h._M_buckets + 2);
  opcode = (Op)uVar1;
  uVar6 = (uint32_t)(_->unresolved_forward_ids_)._M_h._M_bucket_count;
  switch(uVar1) {
  case 0x1484:
  case 0x1485:
    RayReorderNVPass::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,_,inst);
    sVar5 = ValidateHitObjectPointer((ValidationState_t *)this,(Instruction *)_,2);
    if (sVar5 != SPV_SUCCESS) {
      return sVar5;
    }
    num_rows = 0;
    num_cols = 0;
    col_type = 0;
    component_type = 0;
    bVar2 = ValidationState_t::GetMatrixTypeInfo
                      ((ValidationState_t *)this,uVar6,&num_rows,&num_cols,&col_type,&component_type
                      );
    if (bVar2) {
      if (num_cols == 4) {
        bVar2 = ValidationState_t::IsFloatScalarType((ValidationState_t *)this,component_type);
        if (((bVar2) &&
            (uVar6 = ValidationState_t::GetBitWidth((ValidationState_t *)this,uVar6), uVar6 == 0x20)
            ) && (num_rows == 3)) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag
                  (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
        pcVar12 = 
        "expected Result Type matrix to have a Column Type of 3-component 32-bit float vectors: ";
      }
      else {
        ValidationState_t::diag
                  (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
        pcVar12 = "expected Result Type matrix to have a Column Count of 4";
      }
    }
    else {
      ValidationState_t::diag
                (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
      pcVar12 = "expected matrix type as Result Type: ";
    }
    break;
  case 0x1486:
  case 0x1487:
  case 0x1498:
  case 0x1499:
    RayReorderNVPass::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,_,inst);
    sVar5 = ValidateHitObjectPointer((ValidationState_t *)this,(Instruction *)_,2);
    if (sVar5 != SPV_SUCCESS) {
      return sVar5;
    }
    bVar2 = ValidationState_t::IsFloatVectorType((ValidationState_t *)this,uVar6);
    if (((bVar2) &&
        (uVar4 = ValidationState_t::GetDimension((ValidationState_t *)this,uVar6), uVar4 == 3)) &&
       (uVar6 = ValidationState_t::GetBitWidth((ValidationState_t *)this,uVar6), uVar6 == 0x20)) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag
              (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
    pcVar12 = "Expected 32-bit floating-point type 3-component vector as Result Type: ";
    break;
  case 0x1488:
    RayReorderNVPass::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,_,inst);
    sVar5 = ValidateHitObjectPointer((ValidationState_t *)this,(Instruction *)_,0);
    if (sVar5 != SPV_SUCCESS) {
      return sVar5;
    }
    sVar5 = ValidateHitObjectInstructionCommonParameters
                      ((ValidationState_t *)this,(Instruction *)_,1,0xffffffff,0xffffffff,0xffffffff
                       ,2,3,0xffffffff,0xffffffff,4,5,0xffffffff,0xffffffff,6,7,8,9,10,0xc,
                       0xffffffff);
    if (sVar5 != SPV_SUCCESS) {
      return sVar5;
    }
    uVar6 = ValidationState_t::GetOperandTypeId((ValidationState_t *)this,(Instruction *)_,0xb);
    bVar2 = ValidationState_t::IsFloatScalarType((ValidationState_t *)this,uVar6);
    if ((bVar2) &&
       (uVar6 = ValidationState_t::GetBitWidth((ValidationState_t *)this,uVar6), uVar6 == 0x20)) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag
              (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
    pcVar12 = "Current Times must be a 32-bit float scalar type";
    goto LAB_0059aabf;
  case 0x1489:
    RayReorderNVPass::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,_,inst);
    sVar5 = ValidateHitObjectPointer((ValidationState_t *)this,(Instruction *)_,2);
    if (sVar5 != SPV_SUCCESS) {
      return sVar5;
    }
    bVar2 = ValidationState_t::IsIntVectorType((ValidationState_t *)this,uVar6);
    if (((bVar2) &&
        (uVar4 = ValidationState_t::GetDimension((ValidationState_t *)this,uVar6), uVar4 == 2)) &&
       (uVar6 = ValidationState_t::GetBitWidth((ValidationState_t *)this,uVar6), uVar6 == 0x20)) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag
              (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
    std::operator<<((ostream *)&local_248,
                    "Expected 32-bit integer type 2-component vector as Result Type: ");
    opcode = OpHitObjectGetShaderRecordBufferHandleNV;
    goto LAB_0059aab4;
  case 0x148a:
  case 0x1493:
  case 0x1494:
  case 0x1495:
  case 0x1496:
  case 0x1497:
    RayReorderNVPass::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,_,inst);
    sVar5 = ValidateHitObjectPointer((ValidationState_t *)this,(Instruction *)_,2);
    if (sVar5 != SPV_SUCCESS) {
      return sVar5;
    }
    bVar2 = ValidationState_t::IsIntScalarType((ValidationState_t *)this,uVar6);
    if ((bVar2) &&
       (uVar6 = ValidationState_t::GetBitWidth((ValidationState_t *)this,uVar6), uVar6 != 0)) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag
              (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
    pcVar12 = "Expected 32-bit integer type scalar as Result Type: ";
    break;
  case 0x148b:
    RayReorderNVPass::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,_,inst);
    uVar6 = 0;
    goto LAB_0059a58b;
  case 0x148c:
    RayReorderNVPass::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,_,inst);
    sVar5 = ValidateHitObjectPointer((ValidationState_t *)this,(Instruction *)_,0);
    if (sVar5 != SPV_SUCCESS) {
      return sVar5;
    }
    instance_id_index = 0xffffffff;
    hit_object_attr_index = 0xffffffff;
    payload_index = 0xb;
    ray_tmax_index = 10;
    ray_direction_index = 9;
    ray_tmin_index = 8;
    ray_origin_index = 7;
    miss_index = 6;
    sbt_record_stride_index = 0xffffffff;
    uVar4 = 0xffffffff;
    sbt_stride_index = 5;
    sbt_offset_index = 4;
    uVar6 = 0xffffffff;
    hit_kind_index = 0xffffffff;
    cull_mask_index = 3;
    ray_flags_index = 2;
    primtive_id_index = instance_id_index;
    geometry_index = instance_id_index;
    goto LAB_0059a748;
  case 0x148d:
    RayReorderNVPass::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,_,inst);
    sVar5 = ValidateHitObjectPointer((ValidationState_t *)this,(Instruction *)_,0);
    if (sVar5 != SPV_SUCCESS) {
      return sVar5;
    }
    hit_object_attr_index = 0xc;
    ray_tmax_index = 0xb;
    ray_direction_index = 10;
    ray_tmin_index = 9;
    ray_origin_index = 8;
    sbt_record_stride_index = 7;
    uVar4 = 6;
    uVar6 = 0xffffffff;
    goto LAB_0059a742;
  case 0x148e:
    RayReorderNVPass::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,_,inst);
    sVar5 = ValidateHitObjectPointer((ValidationState_t *)this,(Instruction *)_,0);
    if (sVar5 != SPV_SUCCESS) {
      return sVar5;
    }
    hit_object_attr_index = 0xb;
    ray_tmax_index = 10;
    ray_direction_index = 9;
    ray_tmin_index = 8;
    ray_origin_index = 7;
    sbt_record_stride_index = 0xffffffff;
    uVar4 = 0xffffffff;
    uVar6 = 6;
LAB_0059a742:
    payload_index = 0xffffffff;
    miss_index = 0xffffffff;
    sbt_stride_index = 0xffffffff;
    sbt_offset_index = 0xffffffff;
    instance_id_index = 2;
    hit_kind_index = 5;
    cull_mask_index = 0xffffffff;
    ray_flags_index = 0xffffffff;
    primtive_id_index = 3;
    geometry_index = 4;
LAB_0059a748:
    sVar5 = ValidateHitObjectInstructionCommonParameters
                      ((ValidationState_t *)this,(Instruction *)_,1,instance_id_index,
                       primtive_id_index,geometry_index,ray_flags_index,cull_mask_index,
                       hit_kind_index,uVar6,sbt_offset_index,sbt_stride_index,uVar4,
                       sbt_record_stride_index,miss_index,ray_origin_index,ray_tmin_index,
                       ray_direction_index,ray_tmax_index,payload_index,hit_object_attr_index);
    goto LAB_0059a754;
  case 0x148f:
    RayReorderNVPass::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,_,inst);
    sVar5 = ValidateHitObjectPointer((ValidationState_t *)this,(Instruction *)_,0);
    if (sVar5 != SPV_SUCCESS) {
      return sVar5;
    }
    uVar6 = ValidationState_t::GetOperandTypeId((ValidationState_t *)this,(Instruction *)_,1);
    bVar2 = ValidationState_t::IsUnsignedIntScalarType((ValidationState_t *)this,uVar6);
    if ((bVar2) &&
       (uVar6 = ValidationState_t::GetBitWidth((ValidationState_t *)this,uVar6), uVar6 == 0x20)) {
      uVar6 = ValidationState_t::GetOperandTypeId((ValidationState_t *)this,(Instruction *)_,2);
      bVar2 = ValidationState_t::IsFloatVectorType((ValidationState_t *)this,uVar6);
      if (((bVar2) &&
          (uVar4 = ValidationState_t::GetDimension((ValidationState_t *)this,uVar6), uVar4 == 3)) &&
         (uVar6 = ValidationState_t::GetBitWidth((ValidationState_t *)this,uVar6), uVar6 == 0x20)) {
        uVar6 = ValidationState_t::GetOperandTypeId((ValidationState_t *)this,(Instruction *)_,3);
        bVar2 = ValidationState_t::IsFloatScalarType((ValidationState_t *)this,uVar6);
        if ((bVar2) &&
           (uVar6 = ValidationState_t::GetBitWidth((ValidationState_t *)this,uVar6), uVar6 == 0x20))
        {
          uVar6 = ValidationState_t::GetOperandTypeId((ValidationState_t *)this,(Instruction *)_,4);
          bVar2 = ValidationState_t::IsFloatVectorType((ValidationState_t *)this,uVar6);
          if (((bVar2) &&
              (uVar4 = ValidationState_t::GetDimension((ValidationState_t *)this,uVar6), uVar4 == 3)
              ) && (uVar6 = ValidationState_t::GetBitWidth((ValidationState_t *)this,uVar6),
                   uVar6 == 0x20)) {
            uVar6 = ValidationState_t::GetOperandTypeId
                              ((ValidationState_t *)this,(Instruction *)_,5);
            bVar2 = ValidationState_t::IsFloatScalarType((ValidationState_t *)this,uVar6);
            if ((bVar2) &&
               (uVar6 = ValidationState_t::GetBitWidth((ValidationState_t *)this,uVar6),
               uVar6 == 0x20)) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag
                      (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_)
            ;
            pcVar12 = "Ray TMax must be a 32-bit float scalar";
          }
          else {
            ValidationState_t::diag
                      (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_)
            ;
            pcVar12 = "Ray Direction must be a 32-bit float 3-component vector";
          }
        }
        else {
          ValidationState_t::diag
                    (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
          pcVar12 = "Ray TMin must be a 32-bit float scalar";
        }
      }
      else {
        ValidationState_t::diag
                  (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
        pcVar12 = "Ray Origin must be a 32-bit float 3-component vector";
      }
    }
    else {
      ValidationState_t::diag
                (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
      pcVar12 = "Miss Index must be a 32-bit int scalar";
    }
    goto LAB_0059aabf;
  case 0x1490:
    RayReorderNVPass::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,_,inst);
    sVar5 = ValidateHitObjectPointer((ValidationState_t *)this,(Instruction *)_,0);
    if (sVar5 != SPV_SUCCESS) {
      return sVar5;
    }
    uVar7 = Instruction::GetOperandAs<unsigned_int>((Instruction *)_,1);
    pIVar9 = ValidationState_t::FindDef((ValidationState_t *)this,uVar7);
    if (((pIVar9->inst_).opcode == 0x3b) &&
       (SVar8 = Instruction::GetOperandAs<spv::StorageClass>(pIVar9,2), SVar8 == RayPayloadKHR)) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag
              (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
    pcVar12 = "Hit Object Attributes id must be a OpVariable of storage class RayPayloadKHR";
    goto LAB_0059aabf;
  case 0x1491:
  case 0x149a:
  case 0x149b:
    RayReorderNVPass::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,_,inst);
    sVar5 = ValidateHitObjectPointer((ValidationState_t *)this,(Instruction *)_,2);
    if (sVar5 != SPV_SUCCESS) {
      return sVar5;
    }
    bVar2 = ValidationState_t::IsFloatScalarType((ValidationState_t *)this,uVar6);
    if ((bVar2) &&
       (uVar6 = ValidationState_t::GetBitWidth((ValidationState_t *)this,uVar6), uVar6 == 0x20)) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag
              (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
    pcVar12 = "Expected 32-bit floating-point type scalar as Result Type: ";
    break;
  case 0x1492:
    RayReorderNVPass::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,_,inst);
    sVar5 = ValidateHitObjectPointer((ValidationState_t *)this,(Instruction *)_,0);
    if (sVar5 != SPV_SUCCESS) {
      return sVar5;
    }
    uVar7 = Instruction::GetOperandAs<unsigned_int>((Instruction *)_,1);
    pIVar9 = ValidationState_t::FindDef((ValidationState_t *)this,uVar7);
    if (((pIVar9->inst_).opcode == 0x3b) &&
       (SVar8 = Instruction::GetOperandAs<spv::StorageClass>(pIVar9,2),
       SVar8 == HitObjectAttributeNV)) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag
              (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
    pcVar12 = "Hit Object Attributes id must be a OpVariable of storage class HitObjectAttributeNV";
    goto LAB_0059aabf;
  case 0x149c:
  case 0x149d:
  case 0x149e:
    RayReorderNVPass::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,_,inst);
    bVar2 = ValidationState_t::IsBoolScalarType((ValidationState_t *)this,uVar6);
    if (!bVar2) {
      ValidationState_t::diag
                (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
      pcVar12 = "expected Result Type to be bool scalar type";
      goto LAB_0059aabf;
    }
    uVar6 = 2;
LAB_0059a58b:
    sVar5 = ValidateHitObjectPointer((ValidationState_t *)this,(Instruction *)_,uVar6);
LAB_0059a754:
    if (sVar5 == SPV_SUCCESS) {
      return SPV_SUCCESS;
    }
    return sVar5;
  case 0x149f:
    pcVar12 = spvOpcodeString(opcode);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&num_rows,pcVar12,(allocator<char> *)&local_248);
    pFVar10 = ValidationState_t::function
                        ((ValidationState_t *)this,
                         *(uint32_t *)
                          (_->unresolved_forward_ids_)._M_h._M_rehash_policy._M_next_resize);
    std::__cxx11::string::string((string *)&local_248,(string *)&num_rows);
    local_50._8_8_ = 0;
    local_50._M_unused._M_object = ::operator_new(0x20);
    *(code **)local_50._M_unused._0_8_ = (code *)((long)local_50._M_unused._0_8_ + 0x10);
    if (local_248._0_8_ == (long)&local_248 + 0x10U) {
      *(long *)((long)local_50._M_unused._0_8_ + 0x10) = CONCAT71(local_248._17_7_,local_248._16_1_)
      ;
      *(undefined8 *)((long)local_50._M_unused._0_8_ + 0x18) = local_248._24_8_;
    }
    else {
      *(undefined8 *)local_50._M_unused._0_8_ = local_248._0_8_;
      *(long *)((long)local_50._M_unused._0_8_ + 0x10) = CONCAT71(local_248._17_7_,local_248._16_1_)
      ;
    }
    *(undefined8 *)((long)local_50._M_unused._0_8_ + 8) = local_248._8_8_;
    local_248._8_8_ = 0;
    local_248._16_1_ = 0;
    local_38 = std::
               _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_ray_tracing_reorder.cpp:567:15)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_ray_tracing_reorder.cpp:567:15)>
               ::_M_manager;
    local_248._0_8_ = (long)&local_248 + 0x10U;
    std::__cxx11::
    list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
    ::push_back(&pFVar10->execution_model_limitations_,(value_type *)&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    std::__cxx11::string::_M_dispose();
    sVar5 = ValidateHitObjectPointer((ValidationState_t *)this,(Instruction *)_,0);
    if (sVar5 == SPV_SUCCESS) {
      uVar11 = *(long *)&_->generator_ - _->num_words_;
      bVar2 = true;
      sVar5 = SPV_SUCCESS;
      if (0x10 < uVar11) {
        if (uVar11 == 0x30) {
          uVar6 = ValidationState_t::GetOperandTypeId((ValidationState_t *)this,(Instruction *)_,1);
          bVar3 = ValidationState_t::IsIntScalarType((ValidationState_t *)this,uVar6);
          if ((bVar3) &&
             (uVar6 = ValidationState_t::GetBitWidth((ValidationState_t *)this,uVar6), uVar6 == 0x20
             )) {
            uVar6 = ValidationState_t::GetOperandTypeId
                              ((ValidationState_t *)this,(Instruction *)_,2);
            bVar3 = ValidationState_t::IsIntScalarType((ValidationState_t *)this,uVar6);
            if ((bVar3) &&
               (uVar6 = ValidationState_t::GetBitWidth((ValidationState_t *)this,uVar6),
               uVar6 == 0x20)) goto LAB_0059ab81;
            ValidationState_t::diag
                      (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_)
            ;
            pcVar12 = "bits must be a 32-bit int scalar";
          }
          else {
            ValidationState_t::diag
                      (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_)
            ;
            pcVar12 = "Hint must be a 32-bit int scalar";
          }
        }
        else {
          ValidationState_t::diag
                    (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
          std::operator<<((ostream *)&local_248,"Hint and Bits are optional together i.e ");
          pcVar12 = " Either both Hint and Bits should be provided or neither.";
        }
        std::operator<<((ostream *)&local_248,pcVar12);
        DiagnosticStream::~DiagnosticStream(&local_248);
        bVar2 = false;
        sVar5 = local_248.error_;
      }
    }
    else {
      bVar2 = false;
    }
LAB_0059ab81:
    std::__cxx11::string::_M_dispose();
    goto joined_r0x0059a91e;
  case 0x14a0:
    pcVar12 = spvOpcodeString(opcode);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&num_rows,pcVar12,(allocator<char> *)&local_248);
    pFVar10 = ValidationState_t::function
                        ((ValidationState_t *)this,
                         *(uint32_t *)
                          (_->unresolved_forward_ids_)._M_h._M_rehash_policy._M_next_resize);
    std::__cxx11::string::string((string *)&local_248,(string *)&num_rows);
    local_70._8_8_ = 0;
    local_70._M_unused._M_object = ::operator_new(0x20);
    *(code **)local_70._M_unused._0_8_ = (code *)((long)local_70._M_unused._0_8_ + 0x10);
    if (local_248._0_8_ == (long)&local_248 + 0x10U) {
      *(long *)((long)local_70._M_unused._0_8_ + 0x10) = CONCAT71(local_248._17_7_,local_248._16_1_)
      ;
      *(undefined8 *)((long)local_70._M_unused._0_8_ + 0x18) = local_248._24_8_;
    }
    else {
      *(undefined8 *)local_70._M_unused._0_8_ = local_248._0_8_;
      *(long *)((long)local_70._M_unused._0_8_ + 0x10) = CONCAT71(local_248._17_7_,local_248._16_1_)
      ;
    }
    *(undefined8 *)((long)local_70._M_unused._0_8_ + 8) = local_248._8_8_;
    local_248._8_8_ = 0;
    local_248._16_1_ = 0;
    local_58 = std::
               _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_ray_tracing_reorder.cpp:606:15)>
               ::_M_invoke;
    local_60 = std::
               _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_ray_tracing_reorder.cpp:606:15)>
               ::_M_manager;
    local_248._0_8_ = (long)&local_248 + 0x10U;
    std::__cxx11::
    list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
    ::push_back(&pFVar10->execution_model_limitations_,(value_type *)&local_70);
    if (local_60 != (code *)0x0) {
      (*local_60)(&local_70,&local_70,__destroy_functor);
    }
    std::__cxx11::string::_M_dispose();
    uVar6 = ValidationState_t::GetOperandTypeId((ValidationState_t *)this,(Instruction *)_,0);
    bVar2 = ValidationState_t::IsIntScalarType((ValidationState_t *)this,uVar6);
    if ((bVar2) &&
       (uVar6 = ValidationState_t::GetBitWidth((ValidationState_t *)this,uVar6), uVar6 == 0x20)) {
      sVar5 = ValidationState_t::GetOperandTypeId((ValidationState_t *)this,(Instruction *)_,1);
      bVar2 = ValidationState_t::IsIntScalarType((ValidationState_t *)this,sVar5);
      if ((!bVar2) ||
         (uVar6 = ValidationState_t::GetBitWidth((ValidationState_t *)this,sVar5), uVar6 != 0x20)) {
        ValidationState_t::diag
                  (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
        pcVar12 = "bits must be a 32-bit int scalar";
        goto LAB_0059a8f9;
      }
      bVar2 = true;
    }
    else {
      ValidationState_t::diag
                (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
      pcVar12 = "Hint must be a 32-bit int scalar";
LAB_0059a8f9:
      std::operator<<((ostream *)&local_248,pcVar12);
      DiagnosticStream::~DiagnosticStream(&local_248);
      bVar2 = false;
      sVar5 = local_248.error_;
    }
    std::__cxx11::string::_M_dispose();
joined_r0x0059a91e:
    if (bVar2) {
      return SPV_SUCCESS;
    }
    return sVar5;
  default:
    switch(uVar1) {
    case 0x1538:
      RayReorderNVPass::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,_,inst);
      sVar5 = ValidateHitObjectPointer((ValidationState_t *)this,(Instruction *)_,2);
      if (sVar5 != SPV_SUCCESS) {
        return sVar5;
      }
      bVar2 = ValidationState_t::IsFloatVectorType((ValidationState_t *)this,uVar6);
      if (((bVar2) &&
          (uVar4 = ValidationState_t::GetDimension((ValidationState_t *)this,uVar6), uVar4 == 3)) &&
         (uVar6 = ValidationState_t::GetBitWidth((ValidationState_t *)this,uVar6), uVar6 == 0x20)) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag
                (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
      std::operator<<((ostream *)&local_248,
                      "Expected 32-bit floating point 2 component vector type as Result Type: ");
      opcode = OpHitObjectGetSpherePositionNV;
      break;
    case 0x1539:
      RayReorderNVPass::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,_,inst);
      sVar5 = ValidateHitObjectPointer((ValidationState_t *)this,(Instruction *)_,2);
      if (sVar5 != SPV_SUCCESS) {
        return sVar5;
      }
      bVar2 = ValidationState_t::IsFloatScalarType((ValidationState_t *)this,uVar6);
      if ((bVar2) &&
         (uVar6 = ValidationState_t::GetBitWidth((ValidationState_t *)this,uVar6), uVar6 == 0x20)) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag
                (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
      std::operator<<((ostream *)&local_248,"Expected 32-bit floating point scalar as Result Type: "
                     );
      opcode = OpHitObjectGetSphereRadiusNV;
      break;
    case 0x153a:
      RayReorderNVPass::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,_,inst);
      sVar5 = ValidateHitObjectPointer((ValidationState_t *)this,(Instruction *)_,2);
      if (sVar5 != SPV_SUCCESS) {
        return sVar5;
      }
      pIVar9 = ValidationState_t::FindDef((ValidationState_t *)this,uVar6);
      if (((pIVar9->inst_).opcode == 0x1c) &&
         (uVar4 = GetArrayLength((ValidationState_t *)this,pIVar9), uVar4 == 2)) {
        uVar4 = ValidationState_t::GetComponentType((ValidationState_t *)this,uVar6);
        bVar2 = ValidationState_t::IsFloatVectorType((ValidationState_t *)this,uVar4);
        if (bVar2) {
          uVar6 = ValidationState_t::GetComponentType((ValidationState_t *)this,uVar6);
          uVar6 = ValidationState_t::GetDimension((ValidationState_t *)this,uVar6);
          if (uVar6 == 3) {
            return SPV_SUCCESS;
          }
        }
      }
      ValidationState_t::diag
                (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
      std::operator<<((ostream *)&local_248,
                      "Expected 2 element array of 32-bit 3 component float point vector as Result Type: "
                     );
      opcode = OpHitObjectGetLSSPositionsNV;
      break;
    case 0x153b:
      RayReorderNVPass::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,_,inst);
      sVar5 = ValidateHitObjectPointer((ValidationState_t *)this,(Instruction *)_,2);
      if (sVar5 != SPV_SUCCESS) {
        return sVar5;
      }
      bVar2 = ValidationState_t::IsFloatArrayType((ValidationState_t *)this,uVar6);
      if (bVar2) {
        pIVar9 = ValidationState_t::FindDef((ValidationState_t *)this,uVar6);
        uVar4 = GetArrayLength((ValidationState_t *)this,pIVar9);
        if (uVar4 == 2) {
          uVar6 = ValidationState_t::GetComponentType((ValidationState_t *)this,uVar6);
          bVar2 = ValidationState_t::IsFloatScalarType((ValidationState_t *)this,uVar6);
          if (bVar2) {
            return SPV_SUCCESS;
          }
        }
      }
      ValidationState_t::diag
                (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
      std::operator<<((ostream *)&local_248,
                      "Expected 2 element array of 32-bit floating point scalar as Result Type: ");
      opcode = OpHitObjectGetLSSRadiiNV;
      break;
    case 0x153c:
      RayReorderNVPass::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,_,inst);
      sVar5 = ValidateHitObjectPointer((ValidationState_t *)this,(Instruction *)_,2);
      if (sVar5 != SPV_SUCCESS) {
        return sVar5;
      }
      bVar2 = ValidationState_t::IsBoolScalarType((ValidationState_t *)this,uVar6);
      if (bVar2) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag
                (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
      std::operator<<((ostream *)&local_248,"Expected Boolean scalar as Result Type: ");
      opcode = OpHitObjectIsSphereHitNV;
      break;
    case 0x153d:
      RayReorderNVPass::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,_,inst);
      sVar5 = ValidateHitObjectPointer((ValidationState_t *)this,(Instruction *)_,2);
      if (sVar5 != SPV_SUCCESS) {
        return sVar5;
      }
      bVar2 = ValidationState_t::IsBoolScalarType((ValidationState_t *)this,uVar6);
      if (bVar2) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag
                (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
      std::operator<<((ostream *)&local_248,"Expected Boolean scalar as Result Type: ");
      opcode = OpHitObjectIsLSSHitNV;
      break;
    default:
      if (opcode != OpHitObjectGetClusterIdNV) {
        return SPV_SUCCESS;
      }
      RayReorderNVPass::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,_,inst);
      sVar5 = ValidateHitObjectPointer((ValidationState_t *)this,(Instruction *)_,2);
      if (sVar5 != SPV_SUCCESS) {
        return sVar5;
      }
      bVar2 = ValidationState_t::IsIntScalarType((ValidationState_t *)this,uVar6);
      if ((bVar2) &&
         (uVar6 = ValidationState_t::GetBitWidth((ValidationState_t *)this,uVar6), uVar6 == 0x20)) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag
                (&local_248,(ValidationState_t *)this,SPV_ERROR_INVALID_DATA,(Instruction *)_);
      std::operator<<((ostream *)&local_248,"Expected 32-bit integer type scalar as Result Type: ");
      opcode = OpHitObjectGetClusterIdNV;
    }
    goto LAB_0059aab4;
  }
  std::operator<<((ostream *)&local_248,pcVar12);
LAB_0059aab4:
  pcVar12 = spvOpcodeString(opcode);
LAB_0059aabf:
  std::operator<<((ostream *)&local_248,pcVar12);
  DiagnosticStream::~DiagnosticStream(&local_248);
  return local_248.error_;
}

Assistant:

spv_result_t RayReorderNVPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  const uint32_t result_type = inst->type_id();

  auto RegisterOpcodeForValidModel = [](ValidationState_t& vs,
                                        const Instruction* rtinst) {
    std::string opcode_name = spvOpcodeString(rtinst->opcode());
    vs.function(rtinst->function()->id())
        ->RegisterExecutionModelLimitation(
            [opcode_name](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::RayGenerationKHR &&
                  model != spv::ExecutionModel::ClosestHitKHR &&
                  model != spv::ExecutionModel::MissKHR) {
                if (message) {
                  *message = opcode_name +
                             " requires RayGenerationKHR, ClosestHitKHR and "
                             "MissKHR execution models";
                }
                return false;
              }
              return true;
            });
    return;
  };

  switch (opcode) {
    case spv::Op::OpHitObjectIsMissNV:
    case spv::Op::OpHitObjectIsHitNV:
    case spv::Op::OpHitObjectIsEmptyNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (!_.IsBoolScalarType(result_type)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type to be bool scalar type";
      }

      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;
      break;
    }

    case spv::Op::OpHitObjectGetShaderRecordBufferHandleNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      if (!_.IsIntVectorType(result_type) ||
          (_.GetDimension(result_type) != 2) ||
          (_.GetBitWidth(result_type) != 32))
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected 32-bit integer type 2-component vector as Result "
                  "Type: "
               << spvOpcodeString(opcode);
      break;
    }

    case spv::Op::OpHitObjectGetHitKindNV:
    case spv::Op::OpHitObjectGetPrimitiveIndexNV:
    case spv::Op::OpHitObjectGetGeometryIndexNV:
    case spv::Op::OpHitObjectGetInstanceIdNV:
    case spv::Op::OpHitObjectGetInstanceCustomIndexNV:
    case spv::Op::OpHitObjectGetShaderBindingTableRecordIndexNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      if (!_.IsIntScalarType(result_type) || !_.GetBitWidth(result_type))
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected 32-bit integer type scalar as Result Type: "
               << spvOpcodeString(opcode);
      break;
    }

    case spv::Op::OpHitObjectGetCurrentTimeNV:
    case spv::Op::OpHitObjectGetRayTMaxNV:
    case spv::Op::OpHitObjectGetRayTMinNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      if (!_.IsFloatScalarType(result_type) || _.GetBitWidth(result_type) != 32)
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected 32-bit floating-point type scalar as Result Type: "
               << spvOpcodeString(opcode);
      break;
    }

    case spv::Op::OpHitObjectGetObjectToWorldNV:
    case spv::Op::OpHitObjectGetWorldToObjectNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      uint32_t num_rows = 0;
      uint32_t num_cols = 0;
      uint32_t col_type = 0;
      uint32_t component_type = 0;

      if (!_.GetMatrixTypeInfo(result_type, &num_rows, &num_cols, &col_type,
                               &component_type)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected matrix type as Result Type: "
               << spvOpcodeString(opcode);
      }

      if (num_cols != 4) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type matrix to have a Column Count of 4"
               << spvOpcodeString(opcode);
      }

      if (!_.IsFloatScalarType(component_type) ||
          _.GetBitWidth(result_type) != 32 || num_rows != 3) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type matrix to have a Column Type of "
                  "3-component 32-bit float vectors: "
               << spvOpcodeString(opcode);
      }
      break;
    }

    case spv::Op::OpHitObjectGetObjectRayOriginNV:
    case spv::Op::OpHitObjectGetObjectRayDirectionNV:
    case spv::Op::OpHitObjectGetWorldRayDirectionNV:
    case spv::Op::OpHitObjectGetWorldRayOriginNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      if (!_.IsFloatVectorType(result_type) ||
          (_.GetDimension(result_type) != 3) ||
          (_.GetBitWidth(result_type) != 32))
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected 32-bit floating-point type 3-component vector as "
                  "Result Type: "
               << spvOpcodeString(opcode);
      break;
    }

    case spv::Op::OpHitObjectGetAttributesNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 0)) return error;

      const uint32_t hit_object_attr_id = inst->GetOperandAs<uint32_t>(1);
      auto variable = _.FindDef(hit_object_attr_id);
      const auto var_opcode = variable->opcode();
      if (!variable || var_opcode != spv::Op::OpVariable ||
          variable->GetOperandAs<spv::StorageClass>(2) !=
              spv::StorageClass::HitObjectAttributeNV) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Hit Object Attributes id must be a OpVariable of storage "
                  "class HitObjectAttributeNV";
      }
      break;
    }

    case spv::Op::OpHitObjectExecuteShaderNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 0)) return error;

      const uint32_t hit_object_attr_id = inst->GetOperandAs<uint32_t>(1);
      auto variable = _.FindDef(hit_object_attr_id);
      const auto var_opcode = variable->opcode();
      if (!variable || var_opcode != spv::Op::OpVariable ||
          (variable->GetOperandAs<spv::StorageClass>(2)) !=
              spv::StorageClass::RayPayloadKHR) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Hit Object Attributes id must be a OpVariable of storage "
                  "class RayPayloadKHR";
      }
      break;
    }

    case spv::Op::OpHitObjectRecordEmptyNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 0)) return error;
      break;
    }

    case spv::Op::OpHitObjectRecordMissNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 0)) return error;

      const uint32_t miss_index = _.GetOperandTypeId(inst, 1);
      if (!_.IsUnsignedIntScalarType(miss_index) ||
          _.GetBitWidth(miss_index) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Miss Index must be a 32-bit int scalar";
      }

      const uint32_t ray_origin = _.GetOperandTypeId(inst, 2);
      if (!_.IsFloatVectorType(ray_origin) || _.GetDimension(ray_origin) != 3 ||
          _.GetBitWidth(ray_origin) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray Origin must be a 32-bit float 3-component vector";
      }

      const uint32_t ray_tmin = _.GetOperandTypeId(inst, 3);
      if (!_.IsFloatScalarType(ray_tmin) || _.GetBitWidth(ray_tmin) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray TMin must be a 32-bit float scalar";
      }

      const uint32_t ray_direction = _.GetOperandTypeId(inst, 4);
      if (!_.IsFloatVectorType(ray_direction) ||
          _.GetDimension(ray_direction) != 3 ||
          _.GetBitWidth(ray_direction) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray Direction must be a 32-bit float 3-component vector";
      }

      const uint32_t ray_tmax = _.GetOperandTypeId(inst, 5);
      if (!_.IsFloatScalarType(ray_tmax) || _.GetBitWidth(ray_tmax) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray TMax must be a 32-bit float scalar";
      }
      break;
    }

    case spv::Op::OpHitObjectRecordHitWithIndexNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 0)) return error;

      if (auto error = ValidateHitObjectInstructionCommonParameters(
              _, inst, 1 /* Acceleration Struct */, 2 /* Instance Id */,
              3 /* Primtive Id */, 4 /* Geometry Index */,
              KRayParamInvalidId /* Ray Flags */,
              KRayParamInvalidId /* Cull Mask */, 5 /* Hit Kind*/,
              6 /* SBT index */, KRayParamInvalidId /* SBT Offset */,
              KRayParamInvalidId /* SBT Stride */,
              KRayParamInvalidId /* SBT Record Offset */,
              KRayParamInvalidId /* SBT Record Stride */,
              KRayParamInvalidId /* Miss Index */, 7 /* Ray Origin */,
              8 /* Ray TMin */, 9 /* Ray Direction */, 10 /* Ray TMax */,
              KRayParamInvalidId /* Payload */, 11 /* Hit Object Attribute */))
        return error;

      break;
    }

    case spv::Op::OpHitObjectRecordHitNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 0)) return error;

      if (auto error = ValidateHitObjectInstructionCommonParameters(
              _, inst, 1 /* Acceleration Struct */, 2 /* Instance Id */,
              3 /* Primtive Id */, 4 /* Geometry Index */,
              KRayParamInvalidId /* Ray Flags */,
              KRayParamInvalidId /* Cull Mask */, 5 /* Hit Kind*/,
              KRayParamInvalidId /* SBT index */,
              KRayParamInvalidId /* SBT Offset */,
              KRayParamInvalidId /* SBT Stride */, 6 /* SBT Record Offset */,
              7 /* SBT Record Stride */, KRayParamInvalidId /* Miss Index */,
              8 /* Ray Origin */, 9 /* Ray TMin */, 10 /* Ray Direction */,
              11 /* Ray TMax */, KRayParamInvalidId /* Payload */,
              12 /* Hit Object Attribute */))
        return error;

      break;
    }

    case spv::Op::OpHitObjectTraceRayMotionNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 0)) return error;

      if (auto error = ValidateHitObjectInstructionCommonParameters(
              _, inst, 1 /* Acceleration Struct */,
              KRayParamInvalidId /* Instance Id */,
              KRayParamInvalidId /* Primtive Id */,
              KRayParamInvalidId /* Geometry Index */, 2 /* Ray Flags */,
              3 /* Cull Mask */, KRayParamInvalidId /* Hit Kind*/,
              KRayParamInvalidId /* SBT index */, 4 /* SBT Offset */,
              5 /* SBT Stride */, KRayParamInvalidId /* SBT Record Offset */,
              KRayParamInvalidId /* SBT Record Stride */, 6 /* Miss Index */,
              7 /* Ray Origin */, 8 /* Ray TMin */, 9 /* Ray Direction */,
              10 /* Ray TMax */, 12 /* Payload */,
              KRayParamInvalidId /* Hit Object Attribute */))
        return error;
      // Current Time
      const uint32_t current_time_id = _.GetOperandTypeId(inst, 11);
      if (!_.IsFloatScalarType(current_time_id) ||
          _.GetBitWidth(current_time_id) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Current Times must be a 32-bit float scalar type";
      }

      break;
    }

    case spv::Op::OpHitObjectTraceRayNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 0)) return error;

      if (auto error = ValidateHitObjectInstructionCommonParameters(
              _, inst, 1 /* Acceleration Struct */,
              KRayParamInvalidId /* Instance Id */,
              KRayParamInvalidId /* Primtive Id */,
              KRayParamInvalidId /* Geometry Index */, 2 /* Ray Flags */,
              3 /* Cull Mask */, KRayParamInvalidId /* Hit Kind*/,
              KRayParamInvalidId /* SBT index */, 4 /* SBT Offset */,
              5 /* SBT Stride */, KRayParamInvalidId /* SBT Record Offset */,
              KRayParamInvalidId /* SBT Record Stride */, 6 /* Miss Index */,
              7 /* Ray Origin */, 8 /* Ray TMin */, 9 /* Ray Direction */,
              10 /* Ray TMax */, 11 /* Payload */,
              KRayParamInvalidId /* Hit Object Attribute */))
        return error;
      break;
    }

    case spv::Op::OpReorderThreadWithHitObjectNV: {
      std::string opcode_name = spvOpcodeString(inst->opcode());
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [opcode_name](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::RayGenerationKHR) {
                  if (message) {
                    *message = opcode_name +
                               " requires RayGenerationKHR execution model";
                  }
                  return false;
                }
                return true;
              });

      if (auto error = ValidateHitObjectPointer(_, inst, 0)) return error;

      if (inst->operands().size() > 1) {
        if (inst->operands().size() != 3) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Hint and Bits are optional together i.e "
                 << " Either both Hint and Bits should be provided or neither.";
        }

        // Validate the optional opreands Hint and Bits
        const uint32_t hint_id = _.GetOperandTypeId(inst, 1);
        if (!_.IsIntScalarType(hint_id) || _.GetBitWidth(hint_id) != 32) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Hint must be a 32-bit int scalar";
        }
        const uint32_t bits_id = _.GetOperandTypeId(inst, 2);
        if (!_.IsIntScalarType(bits_id) || _.GetBitWidth(bits_id) != 32) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "bits must be a 32-bit int scalar";
        }
      }
      break;
    }

    case spv::Op::OpReorderThreadWithHintNV: {
      std::string opcode_name = spvOpcodeString(inst->opcode());
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [opcode_name](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::RayGenerationKHR) {
                  if (message) {
                    *message = opcode_name +
                               " requires RayGenerationKHR execution model";
                  }
                  return false;
                }
                return true;
              });

      const uint32_t hint_id = _.GetOperandTypeId(inst, 0);
      if (!_.IsIntScalarType(hint_id) || _.GetBitWidth(hint_id) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Hint must be a 32-bit int scalar";
      }

      const uint32_t bits_id = _.GetOperandTypeId(inst, 1);
      if (!_.IsIntScalarType(bits_id) || _.GetBitWidth(bits_id) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "bits must be a 32-bit int scalar";
      }
      break;
    }

    case spv::Op::OpHitObjectGetClusterIdNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      if (!_.IsIntScalarType(result_type) || _.GetBitWidth(result_type) != 32)
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected 32-bit integer type scalar as Result Type: "
               << spvOpcodeString(opcode);
      break;
    }

    case spv::Op::OpHitObjectGetSpherePositionNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      if (!_.IsFloatVectorType(result_type) ||
          _.GetDimension(result_type) != 3 ||
          _.GetBitWidth(result_type) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected 32-bit floating point 2 component vector type as "
                  "Result Type: "
               << spvOpcodeString(opcode);
      }
      break;
    }

    case spv::Op::OpHitObjectGetSphereRadiusNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      if (!_.IsFloatScalarType(result_type) ||
          _.GetBitWidth(result_type) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected 32-bit floating point scalar as Result Type: "
               << spvOpcodeString(opcode);
      }
      break;
    }

    case spv::Op::OpHitObjectGetLSSPositionsNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      auto result_id = _.FindDef(result_type);
      if ((result_id->opcode() != spv::Op::OpTypeArray) ||
          (GetArrayLength(_, result_id) != 2) ||
          !_.IsFloatVectorType(_.GetComponentType(result_type)) ||
          _.GetDimension(_.GetComponentType(result_type)) != 3) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected 2 element array of 32-bit 3 component float point "
                  "vector as Result Type: "
               << spvOpcodeString(opcode);
      }
      break;
    }

    case spv::Op::OpHitObjectGetLSSRadiiNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      if (!_.IsFloatArrayType(result_type) ||
          (GetArrayLength(_, _.FindDef(result_type)) != 2) ||
          !_.IsFloatScalarType(_.GetComponentType(result_type))) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected 2 element array of 32-bit floating point scalar as "
                  "Result Type: "
               << spvOpcodeString(opcode);
      }
      break;
    }

    case spv::Op::OpHitObjectIsSphereHitNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      if (!_.IsBoolScalarType(result_type)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected Boolean scalar as Result Type: "
               << spvOpcodeString(opcode);
      }
      break;
    }

    case spv::Op::OpHitObjectIsLSSHitNV: {
      RegisterOpcodeForValidModel(_, inst);
      if (auto error = ValidateHitObjectPointer(_, inst, 2)) return error;

      if (!_.IsBoolScalarType(result_type)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected Boolean scalar as Result Type: "
               << spvOpcodeString(opcode);
      }
      break;
    }

    default:
      break;
  }
  return SPV_SUCCESS;
}